

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetIF.hpp
# Opt level: O0

int gmlc::netif::getAddresses(int family,IF_ADDRS *addrs)

{
  int iVar1;
  undefined8 in_RSI;
  
  iVar1 = getifaddrs(in_RSI);
  return iVar1;
}

Assistant:

inline auto getAddresses(int family, IF_ADDRS* addrs)
    {
#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
        // Windows API:
        // https://docs.microsoft.com/en-us/windows/win32/api/iphlpapi/nf-iphlpapi-getadaptersaddresses
        DWORD rv = 0;
        ULONG bufLen = 15000;  // recommended size from Windows API docs to avoid error
        ULONG iter = 0;
        do {
            *addrs = (IP_ADAPTER_ADDRESSES*)HeapAlloc(GetProcessHeap(), 0, bufLen);
            if (*addrs == NULL) {
                return -1;
            }

            rv = GetAdaptersAddresses(family, GAA_FLAG_INCLUDE_PREFIX, NULL, *addrs, &bufLen);
            if (rv == ERROR_BUFFER_OVERFLOW) {
                freeAddresses(*addrs);
                *addrs = NULL;
                bufLen = bufLen * 2;  // Double buffer length for the next attempt
            } else {
                break;
            }
            iter++;
        } while ((rv == ERROR_BUFFER_OVERFLOW) && (iter < 3));
        if (rv != NO_ERROR) {
            // May want to change this depending on the type of error
            return -1;
        }
        return 0;
#else
        (void)family;
        return getifaddrs(addrs);
#endif
    }